

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
Validator_circularImportedComponentsDuplicateNames_Test::
~Validator_circularImportedComponentsDuplicateNames_Test
          (Validator_circularImportedComponentsDuplicateNames_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, circularImportedComponentsDuplicateNames)
{
    const std::string errorMessageImporter =
        std::string("Cyclic dependencies were found when attempting to resolve a component in the model 'circularImport1'. The dependency loop is:\n")
        + " - component 'i_am_duplicated' specifies an import from ':this:' to '" + resourcePath("importer/") + "circularImport_2.cellml';\n"
        + " - component 'c2' specifies an import from '" + resourcePath("importer/") + "circularImport_2.cellml' to '" + resourcePath("importer/") + "circularImport_3.cellml';\n"
        + " - component 'c3' specifies an import from '" + resourcePath("importer/") + "circularImport_3.cellml' to '" + resourcePath("importer/") + "circularImport_1.cellml'; and\n"
        + " - component 'i_am_cyclic' specifies an import from '" + resourcePath("importer/") + "circularImport_1.cellml' to '" + resourcePath("importer/") + "circularImport_2.cellml'.";
    const std::vector<std::string> errorMessagesValidator = {
        "Cyclic dependencies were found when attempting to resolve a component in the model 'circularImport1'. The dependency loop is:\n"
        " - component 'i_am_duplicated' specifies an import from ':this:' to 'circularImport_2.cellml';\n"
        " - component 'c2' specifies an import from 'circularImport_2.cellml' to 'circularImport_3.cellml';\n"
        " - component 'c3' specifies an import from 'circularImport_3.cellml' to 'circularImport_1.cellml'; and\n"
        " - component 'i_am_cyclic' specifies an import from 'circularImport_1.cellml' to 'circularImport_2.cellml'.",
        "Model 'circularImport1' contains multiple components with the name 'i_am_duplicated'. Valid component names must be unique to their model.",
    };

    auto parser = libcellml::Parser::create();
    auto validator = libcellml::Validator::create();
    auto importer = libcellml::Importer::create();

    auto model = parser->parseModel(fileContents("importer/circularImport_1_duplicated_name.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    validator->validateModel(model);
    EXPECT_EQ(size_t(1), validator->issueCount());
    EXPECT_EQ(errorMessagesValidator[1], validator->issue(0)->description());
    EXPECT_EQ(model, validator->error(0)->item()->model());

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ(errorMessageImporter, importer->issue(0)->description());
    EXPECT_EQ(model->units(0), importer->issue(0)->item()->units());

    validator->validateModel(model);
    EXPECT_EQ(size_t(2), validator->issueCount());
    EXPECT_EQ_ISSUES(errorMessagesValidator, validator);
}